

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.cpp
# Opt level: O1

void llvm::yaml::MappingTraits<llvm::DWARFYAML::ARange>::mapping(IO *IO,ARange *Range)

{
  EmptyContext local_1e;
  EmptyContext local_1d;
  EmptyContext local_1c;
  EmptyContext local_1b;
  EmptyContext local_1a;
  EmptyContext local_19 [3];
  EmptyContext Ctx_5;
  EmptyContext Ctx_4;
  EmptyContext Ctx_3;
  EmptyContext Ctx_2;
  EmptyContext Ctx_1;
  EmptyContext Ctx;
  
  yaml::IO::processKey<llvm::DWARFYAML::InitialLength,llvm::yaml::EmptyContext>
            (IO,"Length",&Range->Length,true,local_19);
  yaml::IO::processKey<unsigned_short,llvm::yaml::EmptyContext>
            (IO,"Version",&Range->Version,true,&local_1a);
  yaml::IO::processKey<unsigned_int,llvm::yaml::EmptyContext>
            (IO,"CuOffset",&Range->CuOffset,true,&local_1b);
  yaml::IO::processKey<unsigned_char,llvm::yaml::EmptyContext>
            (IO,"AddrSize",&Range->AddrSize,true,&local_1c);
  yaml::IO::processKey<unsigned_char,llvm::yaml::EmptyContext>
            (IO,"SegSize",&Range->SegSize,true,&local_1d);
  yaml::IO::
  processKey<std::vector<llvm::DWARFYAML::ARangeDescriptor,std::allocator<llvm::DWARFYAML::ARangeDescriptor>>,llvm::yaml::EmptyContext>
            (IO,"Descriptors",&Range->Descriptors,true,&local_1e);
  return;
}

Assistant:

void MappingTraits<DWARFYAML::ARange>::mapping(IO &IO,
                                               DWARFYAML::ARange &Range) {
  IO.mapRequired("Length", Range.Length);
  IO.mapRequired("Version", Range.Version);
  IO.mapRequired("CuOffset", Range.CuOffset);
  IO.mapRequired("AddrSize", Range.AddrSize);
  IO.mapRequired("SegSize", Range.SegSize);
  IO.mapRequired("Descriptors", Range.Descriptors);
}